

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  RESOURCE_STATE State_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = State;
  if (((State != RESOURCE_STATE_UNKNOWN) && (State != RESOURCE_STATE_BUILD_AS_READ)) &&
     (State != RESOURCE_STATE_BUILD_AS_WRITE)) {
    FormatString<char[60]>
              ((string *)local_38,
               (char (*) [60])"Unsupported state for a bottom-level acceleration structure");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)local_38);
  }
  this->m_State = msg.field_2._12_4_;
  return;
}

Assistant:

SetState(RESOURCE_STATE State) override final
    {
        DEV_CHECK_ERR(State == RESOURCE_STATE_UNKNOWN || State == RESOURCE_STATE_BUILD_AS_READ || State == RESOURCE_STATE_BUILD_AS_WRITE,
                      "Unsupported state for a bottom-level acceleration structure");
        this->m_State = State;
    }